

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeIndex
          (BinaryReaderObjdumpDisassemble *this,Index value)

{
  Enum EVar1;
  ObjdumpNames *this_00;
  size_t data_size;
  string_view sVar2;
  
  data_size = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
               super_BinaryReaderDelegate.state)->offset - this->current_opcode_offset;
  EVar1 = (this->current_opcode).enum_;
  if (EVar1 - GlobalGet < 2) {
    this_00 = &((this->super_BinaryReaderObjdumpBase).objdump_state_)->global_names;
  }
  else {
    if (EVar1 != Call) goto LAB_00127948;
    this_00 = &((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_names;
  }
  sVar2 = ObjdumpNames::Get(this_00,value);
  if (sVar2.size_ != 0) {
    LogOpcode(this,data_size,"%d <%.*s>",value,sVar2.size_,sVar2.data_);
    return (Result)Ok;
  }
LAB_00127948:
  LogOpcode(this,data_size,"%d",value);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeIndex(Index value) {
  Offset immediate_len = state->offset - current_opcode_offset;
  string_view name;
  if (current_opcode == Opcode::Call &&
      !(name = GetFunctionName(value)).empty()) {
    LogOpcode(immediate_len, "%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::GlobalGet ||
              current_opcode == Opcode::GlobalSet) &&
             !(name = GetGlobalName(value)).empty()) {
    LogOpcode(immediate_len, "%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode(immediate_len, "%d", value);
  }
  return Result::Ok;
}